

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_geometric.cpp
# Opt level: O2

Vector __thiscall Vector::ProjectPlane(Vector *this,Vector *right,Vector *up)

{
  Vector VVar1;
  Vector VVar2;
  Vector VVar3;
  float local_48;
  float fStack_44;
  float local_38;
  Vector local_20;
  
  local_20.m_vec[2] = this->m_vec[2];
  local_20.m_vec._0_8_ = *(undefined8 *)this->m_vec;
  local_20.m_length = -1.0;
  VVar1 = ProjectVector(&local_20,right);
  VVar2 = ProjectVector(&local_20,up);
  local_48 = VVar1.m_vec[0];
  fStack_44 = VVar1.m_vec[1];
  VVar3.m_vec[0] = VVar2.m_vec[0] + local_48;
  VVar3.m_vec[1] = VVar2.m_vec[1] + fStack_44;
  local_38 = VVar1.m_vec[2];
  VVar3.m_vec[2] = VVar2.m_vec[2] + local_38;
  VVar3.m_length = -1.0;
  return VVar3;
}

Assistant:

Vector Vector::ProjectPlane(Vector &right, Vector &up)
{
   Vector src(X(), Y(), Z());
   Vector t1, t2;

   t1 = src.ProjectVector(right);
   t2 = src.ProjectVector(up);

   return t1 + t2;
}